

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O2

void ktxTexture_destruct(ktxTexture *This)

{
  long lVar1;
  ktxStream *pkVar2;
  ktxStream *pkVar3;
  ktxStream stream;
  
  pkVar2 = &This->_protected->_stream;
  pkVar3 = &stream;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    pkVar3->read = pkVar2->read;
    pkVar2 = (ktxStream *)&pkVar2->skip;
    pkVar3 = (ktxStream *)&pkVar3->skip;
  }
  if (stream.data.file != (FILE *)0x0) {
    (*stream.destruct)(&stream);
  }
  if (This->kvDataHead != (ktxHashList)0x0) {
    ktxHashList_Destruct(&This->kvDataHead);
  }
  free(This->kvData);
  free(This->pData);
  free(This->_protected);
  return;
}

Assistant:

void
ktxTexture_destruct(ktxTexture* This)
{
    ktxStream stream = *(ktxTexture_getStream(This));

    if (stream.data.file != NULL)
        stream.destruct(&stream);
    if (This->kvDataHead != NULL)
        ktxHashList_Destruct(&This->kvDataHead);
    if (This->kvData != NULL)
        free(This->kvData);
    if (This->pData != NULL)
        free(This->pData);
    free(This->_protected);
}